

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMux.c
# Opt level: O3

If_Obj_t * Lpk_MapSuppRedDec_rec(Lpk_Man_t *p,uint *pTruth,int nVars,If_Obj_t **ppLeaves)

{
  void **ppvVar1;
  uint *puVar2;
  uint *puVar3;
  Lpk_Man_t *pLVar4;
  If_Obj_t **ppLeaves_00;
  uint uVar5;
  int iVar6;
  int iVar7;
  Kit_DsdNtk_t *pKVar8;
  Kit_DsdNtk_t *pKVar9;
  Kit_DsdNtk_t *pNtk;
  long lVar10;
  If_Obj_t *pIVar11;
  ulong uVar12;
  uint *puVar13;
  ulong uVar14;
  int i_1;
  uint *puVar15;
  int i;
  int iVar16;
  uint uVar17;
  int i_3;
  uint uVar18;
  uint uVar19;
  int i_2;
  uint uVar20;
  int iVar;
  int iVarReused;
  int local_b0;
  uint local_ac;
  int local_a8;
  uint local_a4;
  uint *local_a0;
  uint *local_98;
  uint *local_90;
  uint *local_88;
  Lpk_Man_t *local_80;
  uint *local_78;
  uint *local_70;
  Kit_DsdNtk_t *local_68;
  Kit_DsdNtk_t *local_60;
  uint *local_58;
  uint *local_50;
  uint *local_48;
  uint *local_40;
  If_Obj_t **local_38;
  
  uVar5 = p->vTtNodes->nSize;
  if (((((((int)uVar5 < 1) || (uVar5 == 1)) || (uVar5 < 3)) || ((uVar5 == 3 || (uVar5 < 5)))) ||
      ((uVar5 == 5 || ((uVar5 < 7 || (uVar5 == 7)))))) ||
     ((uVar5 < 9 || (((uVar5 == 9 || (uVar5 < 0xb)) || (local_38 = ppLeaves, uVar5 == 0xb)))))) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar1 = p->vTtNodes->pArray;
  puVar15 = (uint *)*ppvVar1;
  puVar2 = (uint *)ppvVar1[1];
  local_90 = (uint *)ppvVar1[2];
  puVar3 = (uint *)ppvVar1[3];
  local_78 = (uint *)ppvVar1[4];
  local_98 = (uint *)ppvVar1[5];
  local_a0 = (uint *)ppvVar1[6];
  local_58 = (uint *)ppvVar1[7];
  local_88 = (uint *)ppvVar1[8];
  local_48 = (uint *)ppvVar1[9];
  local_50 = (uint *)ppvVar1[10];
  local_40 = (uint *)ppvVar1[0xb];
  uVar5 = Lpk_MapSuppRedDecSelect(p,pTruth,nVars,&local_b0,&local_a8);
  if (uVar5 == 0) {
    return (If_Obj_t *)0x0;
  }
  p->nCalledSRed = p->nCalledSRed + 1;
  local_80 = p;
  Kit_TruthCofactor0New(puVar15,pTruth,nVars,local_b0);
  Kit_TruthCofactor1New(puVar2,pTruth,nVars,local_b0);
  local_a4 = uVar5 & 0xffff;
  pKVar8 = Kit_DsdDecompose(puVar15,nVars);
  local_70 = puVar2;
  pKVar9 = Kit_DsdDecompose(puVar2,nVars);
  pNtk = Kit_DsdExpand(pKVar8);
  local_68 = pNtk;
  Kit_DsdNtkFree(pKVar8);
  local_60 = Kit_DsdExpand(pKVar9);
  Kit_DsdNtkFree(pKVar9);
  pLVar4 = local_80;
  puVar2 = local_90;
  Kit_DsdTruthPartial(local_80->pDsdMan,pNtk,local_90,local_a4);
  pKVar8 = local_60;
  local_ac = (int)uVar5 >> 0x10;
  Kit_DsdTruthPartial(pLVar4->pDsdMan,local_60,puVar3,(int)uVar5 >> 0x10);
  Kit_DsdNtkFree(local_68);
  Kit_DsdNtkFree(pKVar8);
  Kit_TruthMuxVar(local_78,puVar2,puVar3,nVars,local_b0);
  uVar5 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar5 = 1;
  }
  if ((int)uVar5 < 1) goto LAB_0049518a;
  uVar14 = (ulong)uVar5;
  lVar10 = 0;
  puVar13 = puVar2;
  do {
    if (*puVar13 != 0) {
      uVar5 = 0;
      goto LAB_0049515a;
    }
    lVar10 = lVar10 + -0x20;
    puVar13 = puVar13 + 1;
  } while (uVar14 * 0x20 + lVar10 != 0);
  iVar16 = -1;
  goto LAB_00495172;
  while (uVar5 = uVar5 + 1, uVar5 != 0x20) {
LAB_004951ab:
    if ((puVar3[uVar12] >> (uVar5 & 0x1f) & 1) != 0) goto LAB_004951bc;
  }
  uVar5 = 0xffffffff;
LAB_004951bc:
  if ((iVar16 < 0) || ((int)(uVar5 - iVar6) < 0)) goto LAB_0049518a;
  iVar7 = 0;
  uVar12 = 0;
  do {
    if (puVar2[uVar12] != 0xffffffff) {
      uVar20 = 0;
      goto LAB_004951e8;
    }
    uVar12 = uVar12 + 1;
    iVar7 = iVar7 + -0x20;
  } while (uVar14 != uVar12);
  uVar20 = 0xffffffff;
  goto LAB_00495200;
  while (uVar18 = uVar18 + 1, uVar18 != 0x20) {
LAB_0049523b:
    if ((puVar3[uVar12] >> (uVar18 & 0x1f) & 1) == 0) goto LAB_00495250;
  }
  uVar18 = 0xffffffff;
LAB_00495250:
  if ((-1 < (int)uVar20) && (-1 < (int)(uVar18 - iVar7))) {
    uVar12 = uVar14 + 1;
    do {
      local_98[uVar12 - 2] = puVar15[uVar12 - 2];
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
    local_90 = (uint *)CONCAT44(local_90._4_4_,iVar16);
    uVar12 = uVar14 + 1;
    do {
      local_a0[uVar12 - 2] = puVar15[uVar12 - 2];
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
    if (0 < nVars) {
      uVar17 = 0;
      puVar15 = local_98;
      do {
        uVar19 = 1 << ((byte)uVar17 & 0x1f);
        if ((local_a4 >> (uVar17 & 0x1f) & 1) != 0) {
          if ((uVar19 & uVar20) == 0) {
            Kit_TruthCofactor0(puVar15,nVars,uVar17);
          }
          else {
            Kit_TruthCofactor1(puVar15,nVars,uVar17);
          }
          if (((uint)local_90 & uVar19) == 0) {
            Kit_TruthCofactor0(local_a0,nVars,uVar17);
            puVar15 = local_98;
          }
          else {
            Kit_TruthCofactor1(local_a0,nVars,uVar17);
            puVar15 = local_98;
          }
        }
        uVar17 = uVar17 + 1;
      } while (nVars != uVar17);
    }
    puVar15 = local_58;
    uVar12 = uVar14 + 1;
    do {
      local_58[uVar12 - 2] = local_70[uVar12 - 2];
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
    uVar14 = uVar14 + 1;
    do {
      local_88[uVar14 - 2] = local_70[uVar14 - 2];
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
    if (0 < nVars) {
      uVar17 = 0;
      uVar20 = local_ac;
      do {
        uVar19 = 1 << ((byte)uVar17 & 0x1f);
        if ((uVar20 >> (uVar17 & 0x1f) & 1) != 0) {
          if ((uVar19 & uVar18 - iVar7) == 0) {
            Kit_TruthCofactor0(puVar15,nVars,uVar17);
          }
          else {
            Kit_TruthCofactor1(puVar15,nVars,uVar17);
          }
          if ((uVar19 & uVar5 - iVar6) == 0) {
            Kit_TruthCofactor0(local_88,nVars,uVar17);
            uVar20 = local_ac;
          }
          else {
            Kit_TruthCofactor1(local_88,nVars,uVar17);
            uVar20 = local_ac;
          }
        }
        uVar17 = uVar17 + 1;
      } while (nVars != uVar17);
    }
    puVar3 = local_48;
    Kit_TruthMuxVar(local_48,local_98,local_a0,nVars,local_a8);
    puVar2 = local_50;
    Kit_TruthMuxVar(local_50,puVar15,local_88,nVars,local_a8);
    puVar15 = local_40;
    Kit_TruthMuxVar(local_40,puVar3,puVar2,nVars,local_b0);
    pKVar8 = Kit_DsdDecompose(local_78,nVars);
    pKVar9 = Kit_DsdDecompose(puVar15,nVars);
    ppLeaves_00 = local_38;
    pLVar4 = local_80;
    pIVar11 = Lpk_MapTree_rec(local_80,pKVar8,local_38,(uint)pKVar8->Root,(If_Obj_t *)0x0);
    ppLeaves_00[local_a8] = pIVar11;
    pIVar11 = Lpk_MapTree_rec(pLVar4,pKVar9,ppLeaves_00,(uint)pKVar9->Root,(If_Obj_t *)0x0);
    Kit_DsdNtkFree(pKVar8);
    Kit_DsdNtkFree(pKVar9);
    return pIVar11;
  }
  goto LAB_00495219;
  while (uVar5 = uVar5 + 1, uVar5 != 0x20) {
LAB_0049515a:
    if ((*puVar13 >> (uVar5 & 0x1f) & 1) != 0) goto LAB_0049516f;
  }
  uVar5 = 0xffffffff;
LAB_0049516f:
  iVar16 = uVar5 - (int)lVar10;
LAB_00495172:
  iVar6 = 0;
  uVar12 = 0;
  do {
    if (puVar3[uVar12] != 0) {
      uVar5 = 0;
      goto LAB_004951ab;
    }
    uVar12 = uVar12 + 1;
    iVar6 = iVar6 + -0x20;
  } while (uVar14 != uVar12);
LAB_0049518a:
  __assert_fail("TrueMint0 >= 0 && TrueMint1 >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkMux.c"
                ,0xb9,
                "If_Obj_t *Lpk_MapSuppRedDec_rec(Lpk_Man_t *, unsigned int *, int, If_Obj_t **)");
  while (uVar20 = uVar20 + 1, uVar20 != 0x20) {
LAB_004951e8:
    if ((puVar2[uVar12] >> (uVar20 & 0x1f) & 1) == 0) goto LAB_004951fd;
  }
  uVar20 = 0xffffffff;
LAB_004951fd:
  uVar20 = uVar20 - iVar7;
LAB_00495200:
  iVar7 = 0;
  uVar12 = 0;
  do {
    if (puVar3[uVar12] != 0xffffffff) {
      uVar18 = 0;
      goto LAB_0049523b;
    }
    uVar12 = uVar12 + 1;
    iVar7 = iVar7 + -0x20;
  } while (uVar14 != uVar12);
LAB_00495219:
  __assert_fail("FalseMint0 >= 0 && FalseMint1 >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkMux.c"
                ,0xbd,
                "If_Obj_t *Lpk_MapSuppRedDec_rec(Lpk_Man_t *, unsigned int *, int, If_Obj_t **)");
}

Assistant:

If_Obj_t * Lpk_MapSuppRedDec_rec( Lpk_Man_t * p, unsigned * pTruth, int nVars, If_Obj_t ** ppLeaves )
{
    Kit_DsdNtk_t * pNtkDec, * pNtkComp, * ppNtks[2], * pTemp;
    If_Obj_t * pObjNew;
    unsigned * pCof0 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  0 );
    unsigned * pCof1 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  1 );
    unsigned * pDec0 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  2 );
    unsigned * pDec1 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  3 );
    unsigned * pDec  = (unsigned *)Vec_PtrEntry( p->vTtNodes,  4 );
    unsigned * pCo00 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  5 );
    unsigned * pCo01 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  6 );
    unsigned * pCo10 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  7 );
    unsigned * pCo11 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  8 );
    unsigned * pCo0  = (unsigned *)Vec_PtrEntry( p->vTtNodes,  9 );
    unsigned * pCo1  = (unsigned *)Vec_PtrEntry( p->vTtNodes, 10 );
    unsigned * pCo   = (unsigned *)Vec_PtrEntry( p->vTtNodes, 11 );
    int TrueMint0, TrueMint1, FalseMint0, FalseMint1;
    int uSubsets, uSubset0, uSubset1, iVar, iVarReused, i;

    // determine if supp-red decomposition exists
    uSubsets = Lpk_MapSuppRedDecSelect( p, pTruth, nVars, &iVar, &iVarReused );
    if ( uSubsets == 0 )
        return NULL;
    p->nCalledSRed++;

    // get the cofactors
    Kit_TruthCofactor0New( pCof0, pTruth, nVars, iVar );
    Kit_TruthCofactor1New( pCof1, pTruth, nVars, iVar );

    // get the bound sets
    uSubset0 = uSubsets & 0xFFFF;
    uSubset1 = uSubsets >> 16;

    // compute the decomposed functions
    ppNtks[0] = Kit_DsdDecompose( pCof0, nVars );
    ppNtks[1] = Kit_DsdDecompose( pCof1, nVars );
    ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );      Kit_DsdNtkFree( pTemp );
    ppNtks[1] = Kit_DsdExpand( pTemp = ppNtks[1] );      Kit_DsdNtkFree( pTemp );
    Kit_DsdTruthPartial( p->pDsdMan, ppNtks[0], pDec0, uSubset0 );
    Kit_DsdTruthPartial( p->pDsdMan, ppNtks[1], pDec1, uSubset1 );
//    Kit_DsdTruthPartialTwo( p->pDsdMan, ppNtks[0], uSubset0, iVarReused, pCo0, pDec0 );
//    Kit_DsdTruthPartialTwo( p->pDsdMan, ppNtks[1], uSubset1, iVarReused, pCo1, pDec1 );
    Kit_DsdNtkFree( ppNtks[0] );
    Kit_DsdNtkFree( ppNtks[1] );
//Kit_DsdPrintFromTruth( pDec0, nVars );
//Kit_DsdPrintFromTruth( pDec1, nVars );
    // get the decomposed function
    Kit_TruthMuxVar( pDec, pDec0, pDec1, nVars, iVar );

    // find any true assignments of the decomposed functions
    TrueMint0 = Kit_TruthFindFirstBit( pDec0, nVars );
    TrueMint1 = Kit_TruthFindFirstBit( pDec1, nVars );
    assert( TrueMint0 >= 0 && TrueMint1 >= 0 );
    // find any false assignments of the decomposed functions
    FalseMint0 = Kit_TruthFindFirstZero( pDec0, nVars );
    FalseMint1 = Kit_TruthFindFirstZero( pDec1, nVars );
    assert( FalseMint0 >= 0 && FalseMint1 >= 0 );

    // cofactor the cofactors according to these minterms
    Kit_TruthCopy( pCo00, pCof0, nVars );
    Kit_TruthCopy( pCo01, pCof0, nVars );
    for ( i = 0; i < nVars; i++ )
        if ( uSubset0 & (1 << i) )
        {
            if ( FalseMint0 & (1 << i) )
                Kit_TruthCofactor1( pCo00, nVars, i );
            else
                Kit_TruthCofactor0( pCo00, nVars, i );
            if ( TrueMint0 & (1 << i) )
                Kit_TruthCofactor1( pCo01, nVars, i );
            else
                Kit_TruthCofactor0( pCo01, nVars, i );
        }
    Kit_TruthCopy( pCo10, pCof1, nVars );
    Kit_TruthCopy( pCo11, pCof1, nVars );
    for ( i = 0; i < nVars; i++ )
        if ( uSubset1 & (1 << i) )
        {
            if ( FalseMint1 & (1 << i) )
                Kit_TruthCofactor1( pCo10, nVars, i );
            else
                Kit_TruthCofactor0( pCo10, nVars, i );
            if ( TrueMint1 & (1 << i) )
                Kit_TruthCofactor1( pCo11, nVars, i );
            else
                Kit_TruthCofactor0( pCo11, nVars, i );
        }

    // derive the functions by composing them with the new variable (iVarReused)
    Kit_TruthMuxVar( pCo0, pCo00, pCo01, nVars, iVarReused );
    Kit_TruthMuxVar( pCo1, pCo10, pCo11, nVars, iVarReused );
//Kit_DsdPrintFromTruth( pCo0, nVars );
//Kit_DsdPrintFromTruth( pCo1, nVars );

    // derive the composition function
    Kit_TruthMuxVar( pCo , pCo0 , pCo1 , nVars, iVar );

    // process the decomposed function
    pNtkDec = Kit_DsdDecompose( pDec, nVars );
    pNtkComp = Kit_DsdDecompose( pCo, nVars );
//Kit_DsdPrint( stdout, pNtkDec );
//Kit_DsdPrint( stdout, pNtkComp );
//printf( "cofactored variable %c\n", 'a' + iVar );
//printf( "reused variable %c\n", 'a' + iVarReused );

    ppLeaves[iVarReused] = Lpk_MapTree_rec( p, pNtkDec, ppLeaves, pNtkDec->Root, NULL );
    pObjNew = Lpk_MapTree_rec( p, pNtkComp, ppLeaves, pNtkComp->Root, NULL );

    Kit_DsdNtkFree( pNtkDec );
    Kit_DsdNtkFree( pNtkComp );
    return pObjNew;
}